

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-lore.c
# Opt level: O0

void lore_title(textblock *tb,monster_race *race)

{
  wchar_t c;
  wchar_t c_00;
  _Bool _Var1;
  wchar_t optional_char;
  wchar_t standard_char;
  uint8_t optional_attr;
  uint8_t standard_attr;
  monster_race *race_local;
  textblock *tb_local;
  
  if (race == (monster_race *)0x0) {
    __assert_fail("race",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-mon-lore.c"
                  ,0x2c,"void lore_title(textblock *, const struct monster_race *)");
  }
  c = race->d_char;
  c_00 = monster_x_char[race->ridx];
  optional_char._3_1_ = race->d_attr;
  optional_char._2_1_ = monster_x_attr[race->ridx];
  _Var1 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
  if (_Var1) {
    if ((((player->opts).opt[0x10] & 1U) != 0) &&
       (optional_char._3_1_ = 0x11, (optional_char._2_1_ & 0x80) == 0)) {
      optional_char._2_1_ = 0x11;
    }
  }
  else {
    textblock_append(tb,"The ");
  }
  _Var1 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if (_Var1) {
    textblock_append(tb,"%s, the %s",cave->ghost->name,race->name);
  }
  else {
    textblock_append(tb,"%s",race->name);
  }
  textblock_append(tb," (\'");
  textblock_append_pict(tb,optional_char._3_1_,c);
  textblock_append(tb,"\')");
  if ((((optional_char._2_1_ != optional_char._3_1_) || (c_00 != c)) && (tile_width == '\x01')) &&
     (tile_height == '\x01')) {
    textblock_append(tb," (\'");
    textblock_append_pict(tb,optional_char._2_1_,c_00);
    textblock_append(tb,"\')");
  }
  return;
}

Assistant:

void lore_title(textblock *tb, const struct monster_race *race)
{
	uint8_t standard_attr, optional_attr;
	wchar_t standard_char, optional_char;

	assert(race);

	/* Get the chars */
	standard_char = race->d_char;
	optional_char = monster_x_char[race->ridx];

	/* Get the attrs */
	standard_attr = race->d_attr;
	optional_attr = monster_x_attr[race->ridx];

	/* A title (use "The" for non-uniques) */
	if (!rf_has(race->flags, RF_UNIQUE))
		textblock_append(tb, "The ");
	else if (OPT(player, purple_uniques)) {
		standard_attr = COLOUR_VIOLET;
		if (!(optional_attr & 0x80))
			optional_attr = COLOUR_VIOLET;
	}

	/* Dump the name and then append standard attr/char info */
	if (rf_has(race->flags, RF_PLAYER_GHOST)) {
		textblock_append(tb, "%s, the %s", cave->ghost->name, race->name);
	} else {
		textblock_append(tb, "%s", race->name);
	}

	textblock_append(tb, " ('");
	textblock_append_pict(tb, standard_attr, standard_char);
	textblock_append(tb, "')");

	if (((optional_attr != standard_attr) || (optional_char != standard_char))
		&& (tile_width == 1) && (tile_height == 1)) {
		/* Append the "optional" attr/char info */
		textblock_append(tb, " ('");
		textblock_append_pict(tb, optional_attr, optional_char);
		textblock_append(tb, "')");
	}
}